

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

bool kratos::LatchVisitor::IfVisitor::has_var(Var *var,Var *target)

{
  bool bVar1;
  VarType VVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  bool local_52;
  bool local_51;
  VarSlice *slice;
  undefined1 local_38 [6];
  bool right;
  bool left;
  element_type *local_28;
  element_type *expr;
  Var *target_local;
  Var *var_local;
  
  expr = (element_type *)target;
  target_local = var;
  VVar2 = Var::type(var);
  if (VVar2 == Expression) {
    Var::as<kratos::Expr>((Var *)local_38);
    peVar4 = std::__shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2> *)local_38);
    std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_38);
    local_28 = peVar4;
    bVar1 = has_var(peVar4->left,&expr->super_Var);
    if (local_28->right == (Var *)0x0) {
      local_51 = false;
    }
    else {
      local_51 = has_var(local_28->right,&expr->super_Var);
    }
    local_52 = true;
    if (!bVar1) {
      local_52 = local_51;
    }
    var_local._7_1_ = local_52;
  }
  else {
    VVar2 = Var::type(target_local);
    if (VVar2 == Slice) {
      iVar3 = (*(target_local->super_IRNode)._vptr_IRNode[0x29])();
      target_local = (Var *)CONCAT44(extraout_var,iVar3);
    }
    var_local._7_1_ = (element_type *)target_local == expr;
  }
  return var_local._7_1_;
}

Assistant:

bool static has_var(Var* var, Var* target) {
            if (var->type() == VarType::Expression) {
                auto* expr = var->as<Expr>().get();
                bool left = has_var(expr->left, target);
                bool right = expr->right ? has_var(expr->right, target) : false;
                return left || right;
            } else {
                if (var->type() == VarType::Slice) {
                    auto* slice = reinterpret_cast<VarSlice*>(var);
                    var = const_cast<Var*>(slice->get_var_root_parent());
                }
                return var == target;
            }
        }